

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.cpp
# Opt level: O2

void __thiscall
vkt::sr::ShaderRenderCaseInstance::useSampler
          (ShaderRenderCaseInstance *this,deUint32 bindingLocation,deUint32 textureId)

{
  TextureFormat *pTVar1;
  Type textureType;
  VkSampleCountFlagBits VVar2;
  Init textureInit;
  int iVar3;
  TextureBinding *pTVar4;
  Texture1D *pTVar5;
  undefined4 arrayLayers;
  undefined4 uVar6;
  undefined4 uVar7;
  UVec3 texSize;
  Parameters textureParams;
  int iVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  InternalError *this_00;
  long lVar13;
  deUint32 level;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  bool bVar17;
  undefined4 in_stack_fffffffffffffedc;
  undefined4 in_stack_ffffffffffffff04;
  Init IVar18;
  deUint32 local_e8;
  uint local_c8;
  TextureFormat texFormat;
  TextureData textureData;
  undefined4 uStack_78;
  undefined1 local_64 [12];
  ConstPixelBufferAccess layerData;
  
  pTVar4 = (this->m_textures).
           super__Vector_base<de::SharedPtr<vkt::sr::TextureBinding>,_std::allocator<de::SharedPtr<vkt::sr::TextureBinding>_>_>
           ._M_impl.super__Vector_impl_data._M_start[textureId].m_ptr;
  textureType = pTVar4->m_type;
  VVar2 = (pTVar4->m_params).samples;
  texFormat.order = CHANNELORDER_LAST;
  texFormat.type = CHANNELTYPE_LAST;
  tcu::Vector<unsigned_int,_3>::Vector((Vector<unsigned_int,_3> *)&stack0xffffffffffffff08);
  textureData.
  super__Vector_base<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  textureData.
  super__Vector_base<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  textureData.
  super__Vector_base<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  switch(textureType) {
  case TYPE_1D:
    pTVar5 = (pTVar4->m_binding).tex1D;
    texFormat = (pTVar5->super_TextureLevelPyramid).m_format;
    IVar18 = pTVar5->m_width;
    if (VVar2 == VK_SAMPLE_COUNT_1_BIT) {
      uVar11 = ((long)*(pointer *)((long)&(pTVar5->super_TextureLevelPyramid).m_access + 8) -
               *(long *)&(pTVar5->super_TextureLevelPyramid).m_access.
                         super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                         ._M_impl) / 0x28;
    }
    else {
      uVar11 = 1;
    }
    local_c8 = (uint)uVar11;
    std::
    vector<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
    ::resize(&textureData,uVar11 & 0xffffffff);
    lVar13 = 0;
    for (uVar10 = 0; local_c8 != uVar10; uVar10 = uVar10 + 1) {
      if (*(long *)(*(long *)&(pTVar5->super_TextureLevelPyramid).m_data.
                              super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                              ._M_impl + 8 + (long)(int)uVar10 * 0x10) != 0) {
        std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
        push_back((vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                   *)((long)&((textureData.
                               super__Vector_base<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                             )._M_impl.super__Vector_impl_data._M_start + lVar13),
                  (value_type *)
                  ((long)(int)uVar10 * 0x28 +
                  *(long *)&(pTVar5->super_TextureLevelPyramid).m_access.
                            super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                            ._M_impl));
      }
      lVar13 = lVar13 + 0x18;
    }
    goto LAB_0061732d;
  case TYPE_2D:
    pTVar5 = (pTVar4->m_binding).tex1D;
    texFormat = (pTVar5->super_TextureLevelPyramid).m_format;
    IVar18 = (Init)*(undefined8 *)&pTVar5->m_width;
    if (VVar2 == VK_SAMPLE_COUNT_1_BIT) {
      uVar11 = ((long)*(pointer *)((long)&(pTVar5->super_TextureLevelPyramid).m_access + 8) -
               *(long *)&(pTVar5->super_TextureLevelPyramid).m_access.
                         super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                         ._M_impl) / 0x28;
    }
    else {
      uVar11 = 1;
    }
    local_c8 = (uint)uVar11;
    std::
    vector<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
    ::resize(&textureData,uVar11 & 0xffffffff);
    lVar13 = 0;
    for (uVar10 = 0; local_c8 != uVar10; uVar10 = uVar10 + 1) {
      if (*(long *)(*(long *)&(pTVar5->super_TextureLevelPyramid).m_data.
                              super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                              ._M_impl + 8 + (long)(int)uVar10 * 0x10) != 0) {
        std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
        push_back((vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                   *)((long)&((textureData.
                               super__Vector_base<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                             )._M_impl.super__Vector_impl_data._M_start + lVar13),
                  (value_type *)
                  ((long)(int)uVar10 * 0x28 +
                  *(long *)&(pTVar5->super_TextureLevelPyramid).m_access.
                            super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                            ._M_impl));
      }
      lVar13 = lVar13 + 0x18;
    }
    goto LAB_0061732d;
  case TYPE_3D:
    pTVar5 = (pTVar4->m_binding).tex1D;
    texFormat = (pTVar5->super_TextureLevelPyramid).m_format;
    IVar18 = (Init)*(undefined8 *)&pTVar5->m_width;
    if (VVar2 == VK_SAMPLE_COUNT_1_BIT) {
      uVar11 = ((long)*(pointer *)((long)&(pTVar5->super_TextureLevelPyramid).m_access + 8) -
               *(long *)&(pTVar5->super_TextureLevelPyramid).m_access.
                         super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                         ._M_impl) / 0x28;
    }
    else {
      uVar11 = 1;
    }
    local_c8 = (uint)uVar11;
    std::
    vector<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
    ::resize(&textureData,uVar11 & 0xffffffff);
    lVar13 = 0;
    for (uVar10 = 0; local_c8 != uVar10; uVar10 = uVar10 + 1) {
      if (*(long *)(*(long *)&(pTVar5->super_TextureLevelPyramid).m_data.
                              super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                              ._M_impl + 8 + (long)(int)uVar10 * 0x10) != 0) {
        std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
        push_back((vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                   *)((long)&((textureData.
                               super__Vector_base<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                             )._M_impl.super__Vector_impl_data._M_start + lVar13),
                  (value_type *)
                  ((long)(int)uVar10 * 0x28 +
                  *(long *)&(pTVar5->super_TextureLevelPyramid).m_access.
                            super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                            ._M_impl));
      }
      lVar13 = lVar13 + 0x18;
    }
LAB_0061732d:
    local_e8 = 1;
    break;
  case TYPE_CUBE_MAP:
    pTVar5 = (pTVar4->m_binding).tex1D;
    texFormat = (pTVar5->super_TextureLevelPyramid).m_format;
    IVar18 = *(Init *)&(pTVar5->super_TextureLevelPyramid).m_data.
                       super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                       ._M_impl.super__Vector_impl_data;
    if (VVar2 == VK_SAMPLE_COUNT_1_BIT) {
      uVar11 = (*(long *)&pTVar5[2].super_TextureLevelPyramid.m_data.
                          super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                          ._M_impl - *(long *)&pTVar5[2].super_TextureLevelPyramid.m_format) / 0x28;
    }
    else {
      uVar11 = 1;
    }
    std::
    vector<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
    ::resize(&textureData,uVar11 & 0xffffffff);
    uVar14 = 0;
    local_e8 = 6;
    while( true ) {
      uVar10 = (uint)uVar14;
      local_c8 = (uint)uVar11;
      if (uVar10 == local_c8) break;
      for (lVar13 = 0; lVar13 != 0x18; lVar13 = lVar13 + 4) {
        if (*(long *)(*(long *)((long)&(pTVar5->super_TextureLevelPyramid).m_data +
                               (ulong)*(uint *)((long)useSampler::cubeFaceMapping + lVar13) * 0x18 +
                               8) + 8 + (long)(int)uVar10 * 0x10) != 0) {
          std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
          push_back(textureData.
                    super__Vector_base<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar14,
                    (value_type *)
                    (*(long *)((long)&pTVar5[2].super_TextureLevelPyramid.m_format +
                              (ulong)*(uint *)((long)useSampler::cubeFaceMapping + lVar13) * 0x18) +
                    (long)(int)uVar10 * 0x28));
        }
      }
      uVar14 = (ulong)(uVar10 + 1);
    }
    break;
  case TYPE_1D_ARRAY:
    pTVar5 = (pTVar4->m_binding).tex1D;
    texFormat = (pTVar5->super_TextureLevelPyramid).m_format;
    IVar18 = pTVar5->m_width;
    if (VVar2 == VK_SAMPLE_COUNT_1_BIT) {
      uVar11 = ((long)*(pointer *)((long)&(pTVar5->super_TextureLevelPyramid).m_access + 8) -
               *(long *)&(pTVar5->super_TextureLevelPyramid).m_access.
                         super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                         ._M_impl) / 0x28;
    }
    else {
      uVar11 = 1;
    }
    local_e8 = *(deUint32 *)&pTVar5->field_0x3c;
    std::
    vector<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
    ::resize(&textureData,uVar11 & 0xffffffff);
    for (uVar10 = 0; local_c8 = (uint)uVar11, uVar10 != local_c8; uVar10 = uVar10 + 1) {
      if (*(long *)(*(long *)&(pTVar5->super_TextureLevelPyramid).m_data.
                              super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                              ._M_impl + 8 + (long)(int)uVar10 * 0x10) != 0) {
        lVar13 = *(long *)&(pTVar5->super_TextureLevelPyramid).m_access.
                           super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                           ._M_impl;
        lVar12 = (long)(int)uVar10 * 0x28;
        pTVar1 = (TextureFormat *)(lVar13 + lVar12);
        iVar3 = *(int *)(lVar13 + 8 + lVar12);
        iVar8 = tcu::TextureFormat::getPixelSize(pTVar1);
        uVar16 = 0;
        uVar14 = (ulong)local_e8;
        while( true ) {
          bVar17 = uVar14 == 0;
          uVar14 = uVar14 - 1;
          if (bVar17) break;
          tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                    (&layerData,pTVar1,pTVar1[1].order,1,1,(void *)((ulong)uVar16 + (long)pTVar1[4])
                    );
          std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
          push_back(textureData.
                    super__Vector_base<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar10,&layerData);
          uVar16 = uVar16 + iVar3 * iVar8;
        }
      }
    }
    break;
  case TYPE_2D_ARRAY:
    pTVar5 = (pTVar4->m_binding).tex1D;
    texFormat = (pTVar5->super_TextureLevelPyramid).m_format;
    IVar18 = (Init)*(undefined8 *)&pTVar5->m_width;
    if (VVar2 == VK_SAMPLE_COUNT_1_BIT) {
      uVar11 = ((long)*(pointer *)((long)&(pTVar5->super_TextureLevelPyramid).m_access + 8) -
               *(long *)&(pTVar5->super_TextureLevelPyramid).m_access.
                         super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                         ._M_impl) / 0x28;
    }
    else {
      uVar11 = 1;
    }
    local_e8 = (pTVar5->m_view).m_numLevels;
    std::
    vector<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
    ::resize(&textureData,uVar11 & 0xffffffff);
    for (uVar10 = 0; local_c8 = (uint)uVar11, uVar10 != local_c8; uVar10 = uVar10 + 1) {
      if (*(long *)(*(long *)&(pTVar5->super_TextureLevelPyramid).m_data.
                              super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                              ._M_impl + 8 + (long)(int)uVar10 * 0x10) != 0) {
        lVar13 = *(long *)&(pTVar5->super_TextureLevelPyramid).m_access.
                           super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                           ._M_impl;
        lVar12 = (long)(int)uVar10 * 0x28;
        pTVar1 = (TextureFormat *)(lVar13 + lVar12);
        iVar3 = *(int *)(lVar13 + 8 + lVar12);
        iVar8 = *(int *)(lVar13 + 0xc + lVar12);
        iVar9 = tcu::TextureFormat::getPixelSize(pTVar1);
        uVar15 = 0;
        uVar14 = (ulong)local_e8;
        while (bVar17 = uVar14 != 0, uVar14 = uVar14 - 1, bVar17) {
          tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                    (&layerData,pTVar1,pTVar1[1].order,pTVar1[1].type,1,
                     (void *)(uVar15 + (long)pTVar1[4]));
          std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
          push_back(textureData.
                    super__Vector_base<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar10,&layerData);
          uVar15 = (ulong)(uint)((int)uVar15 + iVar8 * iVar3 * iVar9);
        }
      }
    }
    break;
  case TYPE_CUBE_ARRAY:
    pTVar5 = (pTVar4->m_binding).tex1D;
    texFormat = (pTVar5->super_TextureLevelPyramid).m_format;
    IVar18 = pTVar5->m_width;
    if (VVar2 == VK_SAMPLE_COUNT_1_BIT) {
      uVar11 = ((long)*(pointer *)((long)&(pTVar5->super_TextureLevelPyramid).m_access + 8) -
               *(long *)&(pTVar5->super_TextureLevelPyramid).m_access.
                         super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                         ._M_impl) / 0x28;
    }
    else {
      uVar11 = 1;
    }
    local_e8 = *(deUint32 *)&pTVar5->field_0x3c;
    std::
    vector<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
    ::resize(&textureData,uVar11 & 0xffffffff);
    for (uVar10 = 0; local_c8 = (uint)uVar11, uVar10 != local_c8; uVar10 = uVar10 + 1) {
      if (*(long *)(*(long *)&(pTVar5->super_TextureLevelPyramid).m_data.
                              super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                              ._M_impl + 8 + (long)(int)uVar10 * 0x10) != 0) {
        lVar13 = *(long *)&(pTVar5->super_TextureLevelPyramid).m_access.
                           super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                           ._M_impl;
        lVar12 = (long)(int)uVar10 * 0x28;
        pTVar1 = (TextureFormat *)(lVar13 + lVar12);
        iVar3 = *(int *)(lVar13 + 8 + lVar12);
        iVar8 = *(int *)(lVar13 + 0xc + lVar12);
        iVar9 = tcu::TextureFormat::getPixelSize(pTVar1);
        uVar15 = 0;
        uVar14 = (ulong)local_e8;
        while (bVar17 = uVar14 != 0, uVar14 = uVar14 - 1, bVar17) {
          tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                    (&layerData,pTVar1,pTVar1[1].order,pTVar1[1].type,1,
                     (void *)(uVar15 + (long)pTVar1[4]));
          std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
          push_back(textureData.
                    super__Vector_base<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar10,&layerData);
          uVar15 = (ulong)(uint)((int)uVar15 + iVar8 * iVar3 * iVar9);
        }
      }
    }
    break;
  default:
    this_00 = (InternalError *)__cxa_allocate_exception(0x38);
    tcu::InternalError::InternalError
              (this_00,"Invalid texture type",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
               ,0x7c8);
    __cxa_throw(this_00,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
  }
  textureInit = (pTVar4->m_params).initialization;
  tcu::Vector<unsigned_int,_3>::Vector
            ((Vector<unsigned_int,_3> *)local_64,(Vector<unsigned_int,_3> *)&stack0xffffffffffffff08
            );
  arrayLayers = (pTVar4->m_params).baseMipLevel;
  uVar6 = (pTVar4->m_params).samples;
  uVar7 = (pTVar4->m_params).initialization;
  textureParams.componentMapping.a = uVar7;
  textureParams.componentMapping.b = uVar6;
  uStack_78 = (undefined4)
              ((ulong)*(undefined8 *)((long)&(pTVar4->m_params).componentMapping + 8) >> 0x20);
  texSize.m_data[2] = (uint)&pTVar4->m_sampler;
  texSize.m_data._0_8_ = &textureData;
  textureParams.componentMapping.g = uStack_78;
  textureParams._0_8_ = *(undefined8 *)((long)&(pTVar4->m_params).componentMapping + 4);
  textureParams.samples = in_stack_ffffffffffffff04;
  textureParams.initialization = IVar18;
  createSamplerUniform
            (this,bindingLocation,textureType,textureInit,&texFormat,texSize,(TextureData *)local_64
             ,(Sampler *)CONCAT44(in_stack_fffffffffffffedc,local_c8),local_e8,arrayLayers,
             textureParams);
  std::
  vector<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
  ::~vector(&textureData);
  return;
}

Assistant:

void ShaderRenderCaseInstance::useSampler (deUint32 bindingLocation, deUint32 textureId)
{
	DE_ASSERT(textureId < m_textures.size());

	const TextureBinding&				textureBinding		= *m_textures[textureId];
	const TextureBinding::Type			textureType			= textureBinding.getType();
	const tcu::Sampler&					refSampler			= textureBinding.getSampler();
	const TextureBinding::Parameters&	textureParams		= textureBinding.getParameters();
	const bool							isMSTexture			= textureParams.samples != vk::VK_SAMPLE_COUNT_1_BIT;
	deUint32							mipLevels			= 1u;
	deUint32							arrayLayers			= 1u;
	tcu::TextureFormat					texFormat;
	tcu::UVec3							texSize;
	TextureData							textureData;

	if (textureType == TextureBinding::TYPE_2D)
	{
		const tcu::Texture2D&			texture		= textureBinding.get2D();

		texFormat									= texture.getFormat();
		texSize										= tcu::UVec3(texture.getWidth(), texture.getHeight(), 1u);
		mipLevels									= isMSTexture ? 1u : (deUint32)texture.getNumLevels();
		arrayLayers									= 1u;

		textureData.resize(mipLevels);

		for (deUint32 level = 0; level < mipLevels; ++level)
		{
			if (texture.isLevelEmpty(level))
				continue;

			textureData[level].push_back(texture.getLevel(level));
		}
	}
	else if (textureType == TextureBinding::TYPE_CUBE_MAP)
	{
		const tcu::TextureCube&			texture		= textureBinding.getCube();

		texFormat									= texture.getFormat();
		texSize										= tcu::UVec3(texture.getSize(), texture.getSize(), 1u);
		mipLevels									= isMSTexture ? 1u : (deUint32)texture.getNumLevels();
		arrayLayers									= 6u;

		static const tcu::CubeFace		cubeFaceMapping[tcu::CUBEFACE_LAST] =
		{
			tcu::CUBEFACE_POSITIVE_X,
			tcu::CUBEFACE_NEGATIVE_X,
			tcu::CUBEFACE_POSITIVE_Y,
			tcu::CUBEFACE_NEGATIVE_Y,
			tcu::CUBEFACE_POSITIVE_Z,
			tcu::CUBEFACE_NEGATIVE_Z
		};

		textureData.resize(mipLevels);

		for (deUint32 level = 0; level < mipLevels; ++level)
		{
			for (int faceNdx = 0; faceNdx < tcu::CUBEFACE_LAST; ++faceNdx)
			{
				tcu::CubeFace face = cubeFaceMapping[faceNdx];

				if (texture.isLevelEmpty(face, level))
					continue;

				textureData[level].push_back(texture.getLevelFace(level, face));
			}
		}
	}
	else if (textureType == TextureBinding::TYPE_2D_ARRAY)
	{
		const tcu::Texture2DArray&		texture		= textureBinding.get2DArray();

		texFormat									= texture.getFormat();
		texSize										= tcu::UVec3(texture.getWidth(), texture.getHeight(), 1u);
		mipLevels									= isMSTexture ? 1u : (deUint32)texture.getNumLevels();
		arrayLayers									= (deUint32)texture.getNumLayers();

		textureData.resize(mipLevels);

		for (deUint32 level = 0; level < mipLevels; ++level)
		{
			if (texture.isLevelEmpty(level))
				continue;

			const tcu::ConstPixelBufferAccess&	levelLayers		= texture.getLevel(level);
			const deUint32						layerSize		= levelLayers.getWidth() * levelLayers.getHeight() * levelLayers.getFormat().getPixelSize();

			for (deUint32 layer = 0; layer < arrayLayers; ++layer)
			{
				const deUint32					layerOffset		= layerSize * layer;
				tcu::ConstPixelBufferAccess		layerData		(levelLayers.getFormat(), levelLayers.getWidth(), levelLayers.getHeight(), 1, (deUint8*)levelLayers.getDataPtr() + layerOffset);
				textureData[level].push_back(layerData);
			}
		}
	}
	else if (textureType == TextureBinding::TYPE_3D)
	{
		const tcu::Texture3D&			texture		= textureBinding.get3D();

		texFormat									= texture.getFormat();
		texSize										= tcu::UVec3(texture.getWidth(), texture.getHeight(), texture.getDepth());
		mipLevels									= isMSTexture ? 1u : (deUint32)texture.getNumLevels();
		arrayLayers									= 1u;

		textureData.resize(mipLevels);

		for (deUint32 level = 0; level < mipLevels; ++level)
		{
			if (texture.isLevelEmpty(level))
				continue;

			textureData[level].push_back(texture.getLevel(level));
		}
	}
	else if (textureType == TextureBinding::TYPE_1D)
	{
		const tcu::Texture1D&			texture		= textureBinding.get1D();

		texFormat									= texture.getFormat();
		texSize										= tcu::UVec3(texture.getWidth(), 1, 1);
		mipLevels									= isMSTexture ? 1u : (deUint32)texture.getNumLevels();
		arrayLayers									= 1u;

		textureData.resize(mipLevels);

		for (deUint32 level = 0; level < mipLevels; ++level)
		{
			if (texture.isLevelEmpty(level))
				continue;

			textureData[level].push_back(texture.getLevel(level));
		}
	}
	else if (textureType == TextureBinding::TYPE_1D_ARRAY)
	{
		const tcu::Texture1DArray&		texture		= textureBinding.get1DArray();

		texFormat									= texture.getFormat();
		texSize										= tcu::UVec3(texture.getWidth(), 1, 1);
		mipLevels									= isMSTexture ? 1u : (deUint32)texture.getNumLevels();
		arrayLayers									= (deUint32)texture.getNumLayers();

		textureData.resize(mipLevels);

		for (deUint32 level = 0; level < mipLevels; ++level)
		{
			if (texture.isLevelEmpty(level))
				continue;

			const tcu::ConstPixelBufferAccess&	levelLayers		= texture.getLevel(level);
			const deUint32						layerSize		= levelLayers.getWidth() * levelLayers.getFormat().getPixelSize();

			for (deUint32 layer = 0; layer < arrayLayers; ++layer)
			{
				const deUint32					layerOffset		= layerSize * layer;
				tcu::ConstPixelBufferAccess		layerData		(levelLayers.getFormat(), levelLayers.getWidth(), 1, 1, (deUint8*)levelLayers.getDataPtr() + layerOffset);
				textureData[level].push_back(layerData);
			}
		}
	}
	else if (textureType == TextureBinding::TYPE_CUBE_ARRAY)
	{
		const tcu::TextureCubeArray&	texture		= textureBinding.getCubeArray();
		texFormat									= texture.getFormat();
		texSize										= tcu::UVec3(texture.getSize(), texture.getSize(), 1);
		mipLevels									= isMSTexture ? 1u : (deUint32)texture.getNumLevels();
		arrayLayers									= texture.getDepth();

		textureData.resize(mipLevels);

		for (deUint32 level = 0; level < mipLevels; ++level)
		{
			if (texture.isLevelEmpty(level))
				continue;

			const tcu::ConstPixelBufferAccess&	levelLayers		= texture.getLevel(level);
			const deUint32						layerSize		= levelLayers.getWidth() * levelLayers.getHeight() * levelLayers.getFormat().getPixelSize();

			for (deUint32 layer = 0; layer < arrayLayers; ++layer)
			{
				const deUint32					layerOffset		= layerSize * layer;
				tcu::ConstPixelBufferAccess		layerData		(levelLayers.getFormat(), levelLayers.getWidth(), levelLayers.getHeight(), 1, (deUint8*)levelLayers.getDataPtr() + layerOffset);
				textureData[level].push_back(layerData);
			}
		}
	}
	else
	{
		TCU_THROW(InternalError, "Invalid texture type");
	}

	createSamplerUniform(bindingLocation, textureType, textureBinding.getParameters().initialization, texFormat, texSize, textureData, refSampler, mipLevels, arrayLayers, textureParams);
}